

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_skl_motion.cxx
# Opt level: O3

void __thiscall read_bm_0::operator()(read_bm_0 *this,xr_bone_motion **bm,xr_reader *r)

{
  xr_bone_motion *this_00;
  size_t sVar1;
  char name [8];
  char local_30 [8];
  
  this->index = this->index + 1;
  snprintf(local_30,8,"%d");
  this_00 = (xr_bone_motion *)operator_new(0x60);
  this_00->_vptr_xr_bone_motion = (_func_int **)&PTR__xr_bone_motion_0024b338;
  (this_00->m_name)._M_dataplus._M_p = (pointer)&(this_00->m_name).field_2;
  sVar1 = strlen(local_30);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this_00->m_name,local_30,local_30 + sVar1);
  this_00->m_envelopes[4] = (xr_envelope *)0x0;
  this_00->m_envelopes[5] = (xr_envelope *)0x0;
  this_00->m_envelopes[2] = (xr_envelope *)0x0;
  this_00->m_envelopes[3] = (xr_envelope *)0x0;
  this_00->m_envelopes[0] = (xr_envelope *)0x0;
  this_00->m_envelopes[1] = (xr_envelope *)0x0;
  this_00->m_flags = '\0';
  *bm = this_00;
  xray_re::xr_bone_motion::load_0(this_00,r);
  return;
}

Assistant:

void operator()(xr_bone_motion*& bm, xr_reader& r) {
		char name[8];
		xr_snprintf(name, sizeof(name), "%d", index++);
		bm = new xr_bone_motion(name);
		bm->load_0(r);
	}